

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Console::tokenizeLine
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *line)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  string currWord;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  sVar2 = line->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (line->_M_dataplus)._M_p;
    sVar7 = 0;
    bVar5 = false;
    bVar4 = false;
    do {
      cVar1 = pcVar3[sVar7];
      iVar6 = iscntrl((int)cVar1);
      if (iVar6 == 0) {
        if (cVar1 == ' ') {
          if (bVar5) {
            if (bVar4) {
LAB_0010a202:
              std::__cxx11::string::push_back((char)&local_50);
LAB_0010a216:
              std::__cxx11::string::push_back((char)&local_50);
              bVar4 = false;
            }
            else {
LAB_0010a282:
              std::__cxx11::string::push_back((char)&local_50);
            }
          }
          else if (local_50._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
LAB_0010a23f:
            local_50._M_string_length = 0;
            *local_50._M_dataplus._M_p = '\0';
          }
        }
        else if ((bool)(cVar1 == '\\' & (bVar4 ^ 1U))) {
          bVar4 = true;
        }
        else {
          if (bVar4) {
            if ((cVar1 != '\"') && (cVar1 != '\\')) goto LAB_0010a202;
            goto LAB_0010a216;
          }
          if (cVar1 != '\"') goto LAB_0010a282;
          if (bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(__return_storage_ptr__,&local_50);
            bVar5 = false;
            goto LAB_0010a23f;
          }
          bVar5 = true;
        }
      }
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    if (local_50._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Console::tokenizeLine(const std::string &line)
{
    std::vector<std::string> out;
    std::string currWord;
    bool insideQuotes = false;
    bool escapingQuotes = false;
    // TODO: we might want to use getwc() to correctly read unicode characters
    for (const auto& c : line) {
        // ignore control characters
        if (std::iscntrl(c) != 0) {
            // TODO: BOM might not be recognized on non-Windows platforms. We might want to
            // check for it.
            continue;
        }
        else if (c == ' ' && !insideQuotes) {
            // keep spaces inside of quoted text
            if (currWord.empty()) {
                // ignore leading spaces
                continue;
            }
            else {
                // finish off word
                out.push_back(currWord);
                currWord.clear();
            }
        }
        else if (!escapingQuotes && c == '\\') {
            escapingQuotes = true;
        }
        else if (escapingQuotes) {
            if (c != '"' && c != '\\') {
                currWord += '\\';
            }
            currWord += c;
            escapingQuotes = false;
        }
        else if (c == '"') {
            // finish off word or start quoted text
            if (insideQuotes) {
                out.push_back(currWord);
                currWord.clear();
                insideQuotes = false;
            }
            else {
                insideQuotes = true;
            }
        }
        else {
            currWord += c;
        }
    }
    // add the last word
    if (!currWord.empty())
        out.push_back(currWord);
    return out;
}